

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O2

void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *p,Fxu_Var *pVar)

{
  Fxu_Var **ppFVar1;
  Fxu_Lit *pFVar2;
  int iVar3;
  Fxu_ListLit *pFVar4;
  Fxu_Var **ppFVar5;
  Fxu_Lit *pFVar6;
  Fxu_Matrix *p_00;
  Fxu_Var *pVar1;
  
  ppFVar1 = &p->pOrderVars;
  p->ppTailVars = ppFVar1;
  p->pOrderVars = (Fxu_Var *)0x0;
  pFVar4 = &pVar->lLits;
  ppFVar5 = ppFVar1;
  p_00 = p;
  while (pFVar2 = pFVar4->pHead, pFVar6 = pFVar2, pFVar2 != (Fxu_Lit *)0x0) {
    while (pFVar6 = pFVar6->pHPrev, pFVar6 != (Fxu_Lit *)0x0) {
      p_00 = (Fxu_Matrix *)pFVar6->pVar;
      if (*(Fxu_Var **)&p_00->nTableSize == (Fxu_Var *)0x0) {
        *ppFVar5 = (Fxu_Var *)p_00;
        ppFVar5 = (Fxu_Var **)&p_00->nTableSize;
        p->ppTailVars = ppFVar5;
        *(Fxu_Var **)&p_00->nTableSize = (Fxu_Var *)0x1;
      }
    }
    pFVar4 = (Fxu_ListLit *)&pFVar2->pVNext;
  }
  pVar1 = *ppFVar1;
  if (pVar1 != (Fxu_Var *)0x0) {
    for (; pVar1 != (Fxu_Var *)0x1; pVar1 = pVar1->pOrder) {
      iVar3 = Fxu_SingleCountCoincidence(p_00,pVar1,pVar);
      if (iVar3 < 1) {
        __assert_fail("Coin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuSingle.c"
                      ,0xd9,"void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *, Fxu_Var *)");
      }
      if (p->nWeightLimit <= iVar3 + -2) {
        p_00 = p;
        Fxu_MatrixAddSingle(p,pVar1,pVar,iVar3 + -2);
      }
    }
  }
  Fxu_MatrixRingVarsUnmark(p);
  return;
}

Assistant:

void Fxu_MatrixComputeSinglesOne( Fxu_Matrix * p, Fxu_Var * pVar )
{
    Fxu_Lit * pLitV, * pLitH;
    Fxu_Var * pVar2;
    int Coin;
    int WeightCur;

    // start collecting the affected vars
    Fxu_MatrixRingVarsStart( p );
    // go through all the literals of this variable
    for ( pLitV = pVar->lLits.pHead; pLitV; pLitV = pLitV->pVNext )
        // for this literal, go through all the horizontal literals
        for ( pLitH = pLitV->pHPrev; pLitH; pLitH = pLitH->pHPrev )
        {
            // get another variable
            pVar2 = pLitH->pVar;
            // skip the var if it is already used
            if ( pVar2->pOrder )
                continue;
            // skip the var if it belongs to the same node
//            if ( pValue2Node[pVar->iVar] == pValue2Node[pVar2->iVar] )
//                continue;
            // collect the var
            Fxu_MatrixRingVarsAdd( p, pVar2 );
        }
    // stop collecting the selected vars
    Fxu_MatrixRingVarsStop( p );

    // iterate through the selected vars
    Fxu_MatrixForEachVarInRing( p, pVar2 )
    {
        // count the coincidence
        Coin = Fxu_SingleCountCoincidence( p, pVar2, pVar );
        assert( Coin > 0 );
        // get the new weight
        WeightCur = Coin - 2;
        // peformance fix (August 24, 2007)
//        if ( WeightCur >= 0 )
//        Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
        if ( WeightCur >= p->nWeightLimit )
            Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
    }
    // unmark the vars
    Fxu_MatrixRingVarsUnmark( p );
}